

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderBuiltinConstantTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::ShaderBuiltinConstantCase<int>::ShaderBuiltinConstantCase
          (ShaderBuiltinConstantCase<int> *this,Context *context,char *varName,
          GetConstantValueFunc getValue,char *requiredExt)

{
  GetConstantValueFunc __s;
  char *name;
  char *local_d0;
  allocator<char> local_86;
  allocator<char> local_85 [20];
  allocator<char> local_71;
  string local_70;
  string local_50;
  char *local_30;
  char *requiredExt_local;
  GetConstantValueFunc getValue_local;
  char *varName_local;
  Context *context_local;
  ShaderBuiltinConstantCase<int> *this_local;
  
  local_30 = requiredExt;
  requiredExt_local = (char *)getValue;
  getValue_local = (GetConstantValueFunc)varName;
  varName_local = (char *)context;
  context_local = (Context *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,varName,&local_71);
  makeCaseName(&local_50,&local_70);
  name = (char *)std::__cxx11::string::c_str();
  gles31::TestCase::TestCase(&this->super_TestCase,context,name,(char *)getValue_local);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  __s = getValue_local;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderBuiltinConstantCase_032cf558;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_varName,(char *)__s,local_85);
  std::allocator<char>::~allocator(local_85);
  this->m_getValue = (GetConstantValueFunc)requiredExt_local;
  if (local_30 == (char *)0x0) {
    local_d0 = "";
  }
  else {
    local_d0 = local_30;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_requiredExt,local_d0,&local_86);
  std::allocator<char>::~allocator(&local_86);
  return;
}

Assistant:

ShaderBuiltinConstantCase<DataType>::ShaderBuiltinConstantCase (Context& context, const char* varName, GetConstantValueFunc getValue, const char* requiredExt)
	: TestCase		(context, makeCaseName(varName).c_str(), varName)
	, m_varName		(varName)
	, m_getValue	(getValue)
	, m_requiredExt	(requiredExt ? requiredExt : "")
{
	DE_ASSERT(!requiredExt == m_requiredExt.empty());
}